

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O3

bool __thiscall EmmyFacade::PipeListen(EmmyFacade *this,lua_State *L,string *name,string *err)

{
  int iVar1;
  shared_ptr<PipelineServerTransporter> p;
  undefined1 local_49;
  PipelineServerTransporter *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  Destroy(this);
  EmmyDebuggerManager::AddDebugger
            ((EmmyDebuggerManager *)&stack0xffffffffffffffc8,
             (lua_State *)&this->_emmyDebuggerManager);
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  (*lua_sethook)(L,ReadyLuaHook,7,0);
  local_48 = (PipelineServerTransporter *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<PipelineServerTransporter,std::allocator<PipelineServerTransporter>>
            (&local_40,&local_48,(allocator<PipelineServerTransporter> *)&local_49);
  (this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_48->super_Transporter;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_40);
  iVar1 = PipelineServerTransporter::pipe(local_48,(int *)name);
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  return SUB41(iVar1,0);
}

Assistant:

bool EmmyFacade::PipeListen(lua_State *L, const std::string &name, std::string &err) {
	Destroy();

	_emmyDebuggerManager.AddDebugger(L);

	SetReadyHook(L);

	const auto p = std::make_shared<PipelineServerTransporter>();
	transporter = p;
	// p->SetHandler(shared_from_this());
	const auto suc = p->pipe(name, err);
	return suc;
}